

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

void __thiscall QUndoModel::setStack(QUndoModel *this,QUndoStack *stack)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QObject *)this->m_stack;
  if (pQVar1 != (QObject *)stack) {
    if (pQVar1 != (QObject *)0x0) {
      QObject::disconnect(pQVar1,"2cleanChanged(bool)",(QObject *)this,"1stackChanged()");
      QObject::disconnect((QObject *)this->m_stack,"2indexChanged(int)",(QObject *)this,
                          "1stackChanged()");
      QObject::disconnect((QObject *)this->m_stack,"2destroyed(QObject*)",(QObject *)this,
                          "1stackDestroyed(QObject*)");
    }
    this->m_stack = stack;
    if (stack != (QUndoStack *)0x0) {
      QObject::connect(local_30,(char *)stack,(QObject *)"2cleanChanged(bool)",(char *)this,0x7079e8
                      );
      QMetaObject::Connection::~Connection((Connection *)local_30);
      QObject::connect(local_38,(char *)this->m_stack,(QObject *)"2indexChanged(int)",(char *)this,
                       0x7079e8);
      QMetaObject::Connection::~Connection((Connection *)local_38);
      QObject::connect(local_40,(char *)this->m_stack,(QObject *)"2destroyed(QObject*)",(char *)this
                       ,0x707a0b);
      QMetaObject::Connection::~Connection((Connection *)local_40);
    }
    stackChanged(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoModel::setStack(QUndoStack *stack)
{
    if (m_stack == stack)
        return;

    if (m_stack != nullptr) {
        disconnect(m_stack, SIGNAL(cleanChanged(bool)), this, SLOT(stackChanged()));
        disconnect(m_stack, SIGNAL(indexChanged(int)), this, SLOT(stackChanged()));
        disconnect(m_stack, SIGNAL(destroyed(QObject*)), this, SLOT(stackDestroyed(QObject*)));
    }
    m_stack = stack;
    if (m_stack != nullptr) {
        connect(m_stack, SIGNAL(cleanChanged(bool)), this, SLOT(stackChanged()));
        connect(m_stack, SIGNAL(indexChanged(int)), this, SLOT(stackChanged()));
        connect(m_stack, SIGNAL(destroyed(QObject*)), this, SLOT(stackDestroyed(QObject*)));
    }

    stackChanged();
}